

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O0

void pbrt::CleanupPBRT(void)

{
  bool bVar1;
  ulong uVar2;
  char *unaff_retaddr;
  function<void_()> *in_stack_00000010;
  _func_void *in_stack_ffffffffffffffd8;
  function<void_()> *in_stack_ffffffffffffffe0;
  
  std::function<void()>::function<void(&)(),void>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ForEachThread(in_stack_00000010);
  std::function<void_()>::~function((function<void_()> *)0x522b8e);
  if ((*(byte *)(Options + 0x42) & 1) != 0) {
    StatsWritePixelImages();
  }
  if ((*(byte *)(Options + 0x43) & 1) != 0) {
    PrintStats((FILE *)0x522be1);
    ClearStats();
  }
  bVar1 = PrintCheckRare((FILE *)0x522bf5);
  if (!bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      DisconnectFromDisplayServer();
    }
    ParallelCleanup();
    ShutdownLogging();
    Options = 0;
    return;
  }
  ErrorExit<>(unaff_retaddr);
}

Assistant:

void CleanupPBRT() {
    ForEachThread(ReportThreadStats);

    if (Options->recordPixelStatistics)
        StatsWritePixelImages();

    if (Options->printStatistics) {
        PrintStats(stdout);
        ClearStats();
    }
    if (PrintCheckRare(stdout))
        ErrorExit("CHECK_RARE failures");

    if (!Options->displayServer.empty())
        DisconnectFromDisplayServer();

    // API Cleanup
    ParallelCleanup();

    ShutdownLogging();

    Options = nullptr;
}